

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxxopts.hpp
# Opt level: O1

void __thiscall cxxopts::option_exists_error::~option_exists_error(option_exists_error *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  *(undefined ***)&(this->super_OptionSpecException).super_OptionException =
       &PTR__OptionException_0013aeb0;
  pcVar2 = (this->super_OptionSpecException).super_OptionException.m_message._M_dataplus._M_p;
  paVar1 = &(this->super_OptionSpecException).super_OptionException.m_message.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  std::exception::~exception((exception *)this);
  operator_delete(this,0x28);
  return;
}

Assistant:

option_exists_error(const std::string& option)
                : OptionSpecException(u8"Option " + LQUOTE + option + RQUOTE + u8" already exists")
        {
        }